

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RFC1751.cpp
# Opt level: O2

void jbcoin::RFC1751::btoe(string *strHuman,string *strData)

{
  undefined8 uVar1;
  uint uVar2;
  unsigned_long uVar3;
  char cVar4;
  uint uVar5;
  byte local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined8 local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = *(undefined8 *)(strData->_M_dataplus)._M_p;
  cVar4 = '\0';
  local_60[0] = uVar1;
  for (uVar5 = 0; uVar5 < 0x40; uVar5 = uVar5 + 2) {
    uVar3 = extract((char *)local_60,uVar5,2);
    cVar4 = cVar4 + (char)uVar3;
  }
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  uVar5 = (uint)((ulong)uVar1 >> 8) & 0xff;
  std::operator+(&local_1a0,&local_1c0,
                 *(char **)(s_dictionary + (((uint)uVar1 << 0x10 | uVar5 << 8) >> 10 & 0x3ff8)));
  std::operator+(&local_180,&local_1a0," ");
  local_1d0 = (byte)((ulong)uVar1 >> 0x10);
  std::operator+(&local_160,&local_180,
                 *(char **)(s_dictionary + ((uVar5 << 0x10 | (uint)local_1d0 << 8) >> 7 & 0x3ff8)));
  std::operator+(&local_140,&local_160," ");
  uVar5 = (uint)((ulong)uVar1 >> 0x20);
  std::operator+(&local_120,&local_140,
                 *(char **)(s_dictionary +
                           (ulong)((((uint)local_1d0 << 0x10 | (uint)uVar1 >> 0x10) & 0x3ff00 |
                                   uVar5 & 0xff) >> 7) * 8));
  std::operator+(&local_100,&local_120," ");
  std::operator+(&local_e0,&local_100,
                 *(char **)(s_dictionary +
                           ((uVar5 << 0x10 | (uVar5 >> 8 & 0xff) << 8) >> 9 & 0x3ff8)));
  std::operator+(&local_c0,&local_e0," ");
  uVar2 = (uint)(ushort)((ulong)uVar1 >> 0x30);
  std::operator+(&local_a0,&local_c0,
                 *(char **)(s_dictionary +
                           (((uVar5 >> 8) << 0x10 | (uVar2 & 0xff) << 8) >> 6 & 0x3ff8)));
  std::operator+(&local_80,&local_a0," ");
  std::operator+(&local_50,&local_80,
                 *(char **)(s_dictionary +
                           (((uint)(byte)(cVar4 << 6) | (uVar2 & 1) << 0x10 | uVar2 & 0xff00) >> 3))
                );
  std::__cxx11::string::operator=((string *)strHuman,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  return;
}

Assistant:

void RFC1751::btoe (std::string& strHuman, std::string const& strData)
{
    char    caBuffer[9];     /* add in room for the parity 2 bits*/
    int     p, i;

    memcpy (caBuffer, strData.c_str (), 8);

    // compute parity: merely add groups of two bits.
    for (p = 0, i = 0; i < 64; i += 2)
        p += extract (caBuffer, i, 2);

    caBuffer[8] = char (p) << 6;

    strHuman    = std::string ()
                  + s_dictionary[extract (caBuffer, 0, 11)] + " "
                  + s_dictionary[extract (caBuffer, 11, 11)] + " "
                  + s_dictionary[extract (caBuffer, 22, 11)] + " "
                  + s_dictionary[extract (caBuffer, 33, 11)] + " "
                  + s_dictionary[extract (caBuffer, 44, 11)] + " "
                  + s_dictionary[extract (caBuffer, 55, 11)];
}